

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

bool __thiscall
google::
dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
::resize_delta(dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
               *this,size_type delta)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  length_error *this_00;
  byte in_SIL;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  *in_RDI;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  tmp;
  size_type target;
  size_type resize_to;
  size_type needed_size;
  bool did_resize;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  *this_01;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar5;
  int in_stack_ffffffffffffff6c;
  undefined2 uVar6;
  sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *in_stack_ffffffffffffff70;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  *in_stack_ffffffffffffff88;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  *in_stack_ffffffffffffff90;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  *in_stack_ffffffffffffffd0;
  bool local_12;
  bool local_1;
  
  local_12 = false;
  bVar1 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::consider_shrink
                    ((sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *)in_RDI);
  if (bVar1) {
    local_12 = maybe_shrink(in_stack_ffffffffffffffd0);
  }
  bVar3 = in_RDI->num_elements;
  bVar2 = std::numeric_limits<unsigned_char>::max();
  if ((int)(uint)bVar3 < (int)((uint)bVar2 - (uint)in_SIL)) {
    bVar3 = bucket_count(in_RDI);
    if (3 < bVar3) {
      in_stack_ffffffffffffff6c = (uint)in_RDI->num_elements + (uint)in_SIL;
      bVar3 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::
              enlarge_threshold((sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *)in_RDI);
      if (in_stack_ffffffffffffff6c <= (int)(uint)bVar3) {
        return local_12;
      }
    }
    uVar6 = (undefined2)((uint)in_stack_ffffffffffffff6c >> 0x10);
    bVar3 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::min_buckets
                      (in_stack_ffffffffffffff70,
                       (size_type_conflict)((uint)in_stack_ffffffffffffff6c >> 0x18),
                       (size_type_conflict)((uint)in_stack_ffffffffffffff6c >> 0x10));
    bVar2 = bucket_count(in_RDI);
    if (bVar2 < bVar3) {
      uVar5 = CONCAT13((in_RDI->num_elements - in_RDI->num_deleted) + in_SIL,
                       (int3)in_stack_ffffffffffffff60);
      bucket_count(in_RDI);
      bVar3 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::min_buckets
                        (in_stack_ffffffffffffff70,(size_type_conflict)((ushort)uVar6 >> 8),
                         (size_type_conflict)uVar6);
      uVar4 = (uint)in_RDI->num_elements;
      bVar2 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::min_buckets
                        (in_stack_ffffffffffffff70,(size_type_conflict)((ushort)uVar6 >> 8),
                         (size_type_conflict)uVar6);
      if (bVar3 < bVar2) {
        in_stack_ffffffffffffff5c = (uint)bVar3;
        bVar2 = std::numeric_limits<unsigned_char>::max();
        if ((int)in_stack_ffffffffffffff5c < (int)(bVar2 / 2)) {
          sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::shrink_size
                    ((sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *)in_RDI,bVar3 << 1);
        }
      }
      this_01 = (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
                 *)&stack0xffffffffffffff88;
      dense_hashtable(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                      (size_type)((ulong)in_RDI >> 0x38));
      swap((dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
            *)CONCAT44(uVar4,uVar5),
           (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
            *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_1 = true;
      ~dense_hashtable(this_01);
    }
    else {
      local_1 = local_12;
    }
    return local_1;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"resize overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

bool resize_delta(size_type delta) {
    bool did_resize = false;
    if (settings.consider_shrink()) {  // see if lots of deletes happened
      if (maybe_shrink()) did_resize = true;
    }
    if (num_elements >= (std::numeric_limits<size_type>::max)() - delta) {
      throw std::length_error("resize overflow");
    }
    if (bucket_count() >= HT_MIN_BUCKETS &&
        (num_elements + delta) <= settings.enlarge_threshold())
      return did_resize;  // we're ok as we are

    // Sometimes, we need to resize just to get rid of all the
    // "deleted" buckets that are clogging up the hashtable.  So when
    // deciding whether to resize, count the deleted buckets (which
    // are currently taking up room).  But later, when we decide what
    // size to resize to, *don't* count deleted buckets, since they
    // get discarded during the resize.
    size_type needed_size = settings.min_buckets(num_elements + delta, 0);
    if (needed_size <= bucket_count())  // we have enough buckets
      return did_resize;

    size_type resize_to = settings.min_buckets(
        num_elements - num_deleted + delta, bucket_count());

    // When num_deleted is large, we may still grow but we do not want to
    // over expand.  So we reduce needed_size by a portion of num_deleted
    // (the exact portion does not matter).  This is especially helpful
    // when min_load_factor is zero (no shrink at all) to avoid doubling
    // the bucket count to infinity.  See also test ResizeWithoutShrink.
    needed_size = settings.min_buckets(num_elements - num_deleted / 4 + delta, 0);

    if (resize_to < needed_size &&  // may double resize_to
        resize_to < (std::numeric_limits<size_type>::max)() / 2) {
      // This situation means that we have enough deleted elements,
      // that once we purge them, we won't actually have needed to
      // grow.  But we may want to grow anyway: if we just purge one
      // element, say, we'll have to grow anyway next time we
      // insert.  Might as well grow now, since we're already going
      // through the trouble of copying (in order to purge the
      // deleted elements).
      const size_type target =
          static_cast<size_type>(settings.shrink_size(resize_to * 2));
      if (num_elements - num_deleted + delta >= target) {
        // Good, we won't be below the shrink threshhold even if we double.
        resize_to *= 2;
      }
    }
    dense_hashtable tmp(std::move(*this), resize_to);
    swap(tmp);  // now we are tmp
    return true;
  }